

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void __thiscall FConsoleAlias::Run(FConsoleAlias *this,FCommandLine *args,APlayerPawn *who,int key)

{
  char *cmd;
  FString *other;
  FString mycommand;
  FString savedcommand;
  FString local_38;
  FString local_30;
  FString local_28;
  
  if (this->bRunning == true) {
    Printf("Alias %s tried to recurse.\n",(this->super_FConsoleCommand).m_Name);
    return;
  }
  other = this->m_Command + (*(int *)(this->m_Command[1].Chars + -0xc) != 0);
  FString::AttachToOther(&local_28,other);
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_30.Chars = FString::NullString.Nothing;
  local_38.Chars = FString::NullString.Nothing;
  FString::operator=(other,&local_38);
  FString::~FString(&local_38);
  if (this->bDoSubstitution == true) {
    SubstituteAliasParams(&local_38,(FCommandLine *)&local_28);
    FString::operator=(&local_30,&local_38);
    FString::~FString(&local_38);
  }
  else {
    FString::operator=(&local_30,&local_28);
  }
  this->bRunning = true;
  cmd = FString::LockBuffer(&local_30);
  AddCommandString(cmd,key);
  FString::UnlockBuffer(&local_30);
  this->bRunning = false;
  if (*(int *)(other->Chars + -0xc) == 0) {
    FString::operator=(other,&local_28);
  }
  if (this->bKill == true) {
    (*(this->super_FConsoleCommand)._vptr_FConsoleCommand[1])(this);
  }
  FString::~FString(&local_30);
  FString::~FString(&local_28);
  return;
}

Assistant:

void FConsoleAlias::Run (FCommandLine &args, APlayerPawn *who, int key)
{
	if (bRunning)
	{
		Printf ("Alias %s tried to recurse.\n", m_Name);
		return;
	}

	int index = !m_Command[1].IsEmpty();
	FString savedcommand = m_Command[index], mycommand;
	m_Command[index] = FString();

	if (bDoSubstitution)
	{
		mycommand = SubstituteAliasParams (savedcommand, args);
	}
	else
	{
		mycommand = savedcommand;
	}

	bRunning = true;
	AddCommandString (mycommand.LockBuffer(), key);
	mycommand.UnlockBuffer();
	bRunning = false;
	if (m_Command[index].IsEmpty())
	{ // The alias is unchanged, so put the command back so it can be used again.
	  // If the command had been non-empty, then that means that executing this
	  // alias caused it to realias itself, so the old command will be forgotten
	  // once this function returns.
		m_Command[index] = savedcommand;
	}
	if (bKill)
	{ // The alias wants to remove itself
		delete this;
	}
}